

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Fts5TermsetFree(Fts5Termset *p)

{
  Fts5TermsetEntry *pFVar1;
  Fts5TermsetEntry *p_00;
  long lVar2;
  
  if (p == (Fts5Termset *)0x0) {
    return;
  }
  lVar2 = 0;
  do {
    p_00 = p->apHash[lVar2];
    while (p_00 != (Fts5TermsetEntry *)0x0) {
      pFVar1 = p_00->pNext;
      sqlite3_free(p_00);
      p_00 = pFVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  sqlite3_free(p);
  return;
}

Assistant:

static void sqlite3Fts5TermsetFree(Fts5Termset *p){
  if( p ){
    u32 i;
    for(i=0; i<ArraySize(p->apHash); i++){
      Fts5TermsetEntry *pEntry = p->apHash[i];
      while( pEntry ){
        Fts5TermsetEntry *pDel = pEntry;
        pEntry = pEntry->pNext;
        sqlite3_free(pDel);
      }
    }
    sqlite3_free(p);
  }
}